

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_argmax(ggml_context *ctx,ggml_tensor *a)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  undefined8 in_stack_ffffffffffffffe8;
  ggml_type type;
  
  type = (ggml_type)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  _Var1 = ggml_is_matrix(in_RSI);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x8e4
               ,"GGML_ASSERT(%s) failed","ggml_is_matrix(a)");
  }
  if (0x7fffffff < in_RSI->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x8e5
               ,"GGML_ASSERT(%s) failed","a->ne[0] <= INT32_MAX");
  }
  pgVar2 = ggml_new_tensor_1d((ggml_context *)in_RSI,type,0x14bd85);
  pgVar2->op = GGML_OP_ARGMAX;
  pgVar2->src[0] = in_RSI;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_argmax(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    GGML_ASSERT(ggml_is_matrix(a));
    GGML_ASSERT(a->ne[0] <= INT32_MAX);

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, a->ne[1]);

    result->op     = GGML_OP_ARGMAX;
    result->src[0] = a;

    return result;
}